

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest_Empty_Test::TestBody(InterpTest_Empty_Test *this)

{
  Module *pMVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string local_58;
  AssertHelper local_30;
  
  pMVar1 = (this->super_InterpTest).mod_.obj_;
  local_70[0] = (internal)(pMVar1 == (Module *)0x0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_70[0]) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_70,(AssertionResult *)"mod_.empty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x3f,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  if (pMVar1 == (Module *)0x0) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    local_58._M_dataplus._M_p = (pointer)operator_new(8);
    local_58._M_string_length = (size_type)(local_58._M_dataplus._M_p + 8);
    local_58._M_dataplus._M_p[0] = '\0';
    local_58._M_dataplus._M_p[1] = 'a';
    local_58._M_dataplus._M_p[2] = 's';
    local_58._M_dataplus._M_p[3] = 'm';
    local_58._M_dataplus._M_p[4] = '\x01';
    local_58._M_dataplus._M_p[5] = '\0';
    local_58._M_dataplus._M_p[6] = '\0';
    local_58._M_dataplus._M_p[7] = '\0';
    local_58.field_2._M_allocated_capacity = local_58._M_string_length;
    InterpTest::ReadModule
              (&this->super_InterpTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
    if (local_58._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_58._M_dataplus._M_p,
                      local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
    }
    local_58._M_dataplus._M_p = (char *)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)&local_58);
    if (local_58._M_dataplus._M_p != (char *)0x0) {
      operator_delete(local_58._M_dataplus._M_p,
                      local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
    }
    local_70[0] = (internal)((this->super_InterpTest).mod_.obj_ != (Module *)0x0);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_70[0]) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,local_70,(AssertionResult *)"mod_.empty()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x42,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  return;
}

Assistant:

TEST_F(InterpTest, Empty) {
  ASSERT_TRUE(mod_.empty());
  ReadModule({0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00});
  Instantiate();
  ASSERT_FALSE(mod_.empty());
}